

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::anon_unknown_31::FailureTest::~FailureTest(FailureTest *this)

{
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FailureTest_0015a7c0;
  std::__cxx11::string::~string((string *)&this->error_message_);
  std::__cxx11::string::~string((string *)&this->loc_);
  Test::~Test(&this->super_Test);
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}